

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O0

float_t __thiscall djb::tab_r::qf2(tab_r *this,float_t u,float_t qf1,float_t zi)

{
  float_t fVar1;
  int iVar2;
  float_t fVar3;
  double dVar4;
  int local_34;
  float local_30;
  int32_t level;
  float_t delta;
  float_t u2;
  float_t epsilon;
  float_t zi_local;
  float_t qf1_local;
  float_t u_local;
  tab_r *this_local;
  
  level = 0;
  zi_local = u;
  _qf1_local = this;
  local_30 = sat<float>(&zi_local);
  local_34 = 0;
  if (local_30 < 1.0) {
    for (; dVar4 = std::fabs((double)(ulong)(uint)local_30),
        1e-05 < SUB84(dVar4,0) && local_34 < 0x1e; local_34 = local_34 + 1) {
      iVar2 = sgn<float>(local_30);
      fVar1 = zi_local;
      level = (int32_t)((float)iVar2 / (float)(2 << ((byte)local_34 & 0x1f)) + (float)level);
      fVar3 = cdf2(this,(float_t)level,qf1,zi);
      local_30 = fVar1 - fVar3;
    }
    this_local._4_4_ = (float_t)level;
  }
  else {
    this_local._4_4_ = 1.0;
  }
  return this_local._4_4_;
}

Assistant:

float_t tab_r::qf2(float_t u, float_t qf1, float_t zi) const
{
	const float_t epsilon = 1e-5;
	float_t u2 = 0, delta = sat(u);
	int32_t level = 0;

	if (delta >= 1) return 1;

	while (fabs(delta) > epsilon && level < 30) {
		u2+= (float_t)sgn(delta) / (2 << level);
		delta = u - cdf2(u2, qf1, zi);
		++level;
	}

	return u2;
}